

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

bool units::isolatePriorModifier(string *unit_string,string *modifier,char check1,char check2)

{
  char cVar1;
  char cVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_type __pos;
  size_type sVar7;
  size_type sVar8;
  size_type sVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  
  bVar11 = false;
  __pos = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     unit_string,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)modifier,0
                    );
  if (__pos != 0xffffffffffffffff) {
    sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              unit_string,' ',
                              (ulong)((modifier->_M_dataplus)._M_p[modifier->_M_string_length - 1]
                                     != ' ') + modifier->_M_string_length + __pos);
    if ((sVar7 == 0xffffffffffffffff) ||
       (pcVar3 = (unit_string->_M_dataplus)._M_p, cVar1 = pcVar3[sVar7],
       cVar1 != check1 && cVar1 != check2)) {
      bVar11 = false;
    }
    else {
      pcVar3[sVar7 - 1] = '_';
      bVar11 = true;
    }
    sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 ' ',sVar7);
    if (sVar7 < unit_string->_M_string_length) {
      pcVar3 = (unit_string->_M_dataplus)._M_p;
      cVar1 = pcVar3[sVar7 + 1];
      if ((cVar1 != '*') && (cVar1 != '/')) {
        cVar2 = pcVar3[sVar7 - 1];
        bVar10 = cVar2 == '*' || cVar2 == '/';
        if ((cVar2 != '*') && (cVar2 != '/')) {
          bVar10 = true;
          bVar4 = bVar10;
          bVar5 = bVar10;
          if ((cVar2 != '(' && cVar1 != '(') && (bVar5 = false, cVar1 != '-')) {
            bVar4 = cVar2 == '-';
          }
          bVar12 = bVar10;
          if (!(bool)(bVar5 | bVar4)) {
            iVar6 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               unit_string,sVar7 + 1,2,"of");
            bVar12 = iVar6 == 0;
          }
          bVar12 = (bool)(bVar12 | bVar5 | bVar4);
          if (!bVar12) {
            bVar10 = (unit_string->_M_dataplus)._M_p[sVar7 + 1] == 'U';
          }
          bVar10 = (bool)(bVar10 | bVar12);
        }
        bVar4 = bVar10;
        if (!bVar10) {
          sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  rfind(unit_string,'/',__pos);
          sVar9 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             unit_string,'/',__pos + 1);
          if (sVar8 < __pos) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   sVar8 + 1,1,'(');
            if (sVar9 == 0xffffffffffffffff) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        unit_string,')');
            }
            else {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     unit_string,sVar9 + 1,1,')');
            }
            bVar4 = sVar9 <= sVar7;
            bVar11 = true;
            sVar7 = sVar7 + 1;
          }
          else {
            bVar4 = true;
            if (sVar7 <= sVar9) {
              bVar4 = bVar10;
            }
          }
        }
        if (!bVar4) {
          (unit_string->_M_dataplus)._M_p[sVar7] = '*';
          bVar11 = true;
        }
      }
    }
  }
  return bVar11;
}

Assistant:

static bool isolatePriorModifier(
    std::string& unit_string,
    const std::string& modifier,
    char check1,
    char check2)
{
    bool modified{false};
    auto modfind = unit_string.find(modifier);
    if (modfind != std::string::npos) {
        auto offset = modfind + modifier.size();
        // LCOV_EXCL_START
        // this condition is not used in current use cases but it is dangerous
        // to make assumptions that will always be the case
        if (modifier.back() != ' ') {
            ++offset;
        }
        // LCOV_EXCL_STOP
        auto kloc = unit_string.find_first_not_of(' ', offset);
        if (kloc != std::string::npos &&
            (unit_string[kloc] == check1 || unit_string[kloc] == check2)) {
            // this handles a misinterpretation of square+d to squared when in
            // middle of a unit
            unit_string[kloc - 1] = '_';
            modified = true;
        }
        auto nspace = unit_string.find_first_of(' ', kloc);
        auto skip = (nspace >= unit_string.size());
        if (!skip) {
            skip = isOperator(unit_string[nspace + 1]) ||
                isOperator(unit_string[nspace - 1]);
        }
        if (!skip) {
            skip = unit_string[nspace + 1] == '(' ||
                unit_string[nspace - 1] == '(';
            skip |=
                (skip || unit_string[nspace + 1] == '-' ||
                 unit_string[nspace - 1] == '-');
            skip |= skip || (unit_string.compare(nspace + 1, 2, "of") == 0);
            skip |= skip ||
                unit_string[nspace + 1] ==
                    'U';  // handle distance units with UK or US modifier
        }
        if (!skip) {
            auto divloc = unit_string.find_last_of('/', modfind);
            auto divloc2 = unit_string.find_first_of('/', modfind + 1);
            if (divloc < modfind) {
                unit_string.insert(divloc + 1, 1, '(');
                ++nspace;
                if (divloc2 != std::string::npos) {
                    unit_string.insert(divloc2 + 1, 1, ')');
                    // don't worry about nspace increment here as it will be
                    // skipped or the insertion after the space
                } else {
                    unit_string.push_back(')');
                }

                skip |= (divloc2 < nspace);
                modified = true;
            } else if (divloc2 < nspace) {
                skip = true;
            }
        }
        if (!skip) {
            unit_string[nspace] = '*';
            modified = true;
        }
    }
    return modified;
}